

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O3

TimeZoneGenericNameMatchInfo * __thiscall
icu_63::TZGNCore::findLocal
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  StringEnumeration *pSVar3;
  undefined4 extraout_var;
  TimeZoneGenericNameMatchInfo *pTVar4;
  _func_int **pp_Var5;
  int iVar6;
  UnicodeString *size;
  UVector *pUVar7;
  GNameSearchHandler handler;
  TextTrieMapSearchResultHandler local_50;
  uint32_t local_48;
  UVector *local_40;
  int local_38;
  
  local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_003eca88;
  local_40 = (UVector *)0x0;
  local_38 = 0;
  local_48 = types;
  umtx_lock_63((UMutex *)gLock);
  size = text;
  TextTrieMap::search(&this->fGNamesTrie,text,start,&local_50,status);
  umtx_unlock_63((UMutex *)gLock);
  iVar2 = local_38;
  pUVar7 = local_40;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_40 = (UVector *)0x0;
    local_38 = 0;
    if (pUVar7 == (UVector *)0x0) {
LAB_00212a45:
      umtx_lock_63((UMutex *)gLock);
      if (this->fGNamesTrieFullyLoaded == '\0') {
        pSVar3 = TimeZone::createTimeZoneIDEnumeration
                           (UCAL_ZONE_TYPE_CANONICAL,(char *)0x0,(int32_t *)0x0,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          while( true ) {
            iVar2 = (*(pSVar3->super_UObject)._vptr_UObject[7])(pSVar3,status);
            if (((UnicodeString *)CONCAT44(extraout_var,iVar2) == (UnicodeString *)0x0) ||
               (U_ZERO_ERROR < *status)) break;
            loadStrings(this,(UnicodeString *)CONCAT44(extraout_var,iVar2));
          }
        }
        else if (pSVar3 == (StringEnumeration *)0x0) goto LAB_00212ab6;
        (*(pSVar3->super_UObject)._vptr_UObject[1])(pSVar3);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          this->fGNamesTrieFullyLoaded = '\x01';
        }
      }
LAB_00212ab6:
      umtx_unlock_63((UMutex *)gLock);
      if (U_ZERO_ERROR < *status) goto LAB_00212b78;
      umtx_lock_63((UMutex *)gLock);
      TextTrieMap::search(&this->fGNamesTrie,text,start,&local_50,status);
      umtx_unlock_63((UMutex *)gLock);
      iVar2 = local_38;
      pUVar7 = local_40;
      local_40 = (UVector *)0x0;
      local_38 = 0;
      if ((pUVar7 == (UVector *)0x0) || (iVar2 < 1)) {
        local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_003eca88;
        pTVar4 = (TimeZoneGenericNameMatchInfo *)0x0;
        goto LAB_00212b97;
      }
      pTVar4 = (TimeZoneGenericNameMatchInfo *)UMemory::operator_new((UMemory *)0x8,(size_t)text);
      if (pTVar4 == (TimeZoneGenericNameMatchInfo *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        pp_Var5 = (pUVar7->super_UObject)._vptr_UObject;
        goto LAB_00212b75;
      }
      pTVar4->fMatches = pUVar7;
    }
    else {
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      if ((iVar2 != iVar6 - start) && (this->fGNamesTrieFullyLoaded == '\0')) {
        (*(pUVar7->super_UObject)._vptr_UObject[1])(pUVar7);
        goto LAB_00212a45;
      }
      pTVar4 = (TimeZoneGenericNameMatchInfo *)UMemory::operator_new((UMemory *)0x8,(size_t)size);
      if (pTVar4 == (TimeZoneGenericNameMatchInfo *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        pp_Var5 = (pUVar7->super_UObject)._vptr_UObject;
LAB_00212b75:
        (*pp_Var5[1])(pUVar7);
        goto LAB_00212b78;
      }
      pTVar4->fMatches = pUVar7;
    }
  }
  else {
LAB_00212b78:
    pTVar4 = (TimeZoneGenericNameMatchInfo *)0x0;
  }
  local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_003eca88;
  if (local_40 != (UVector *)0x0) {
    (*(local_40->super_UObject)._vptr_UObject[1])();
  }
LAB_00212b97:
  TextTrieMapSearchResultHandler::~TextTrieMapSearchResultHandler(&local_50);
  return pTVar4;
}

Assistant:

TimeZoneGenericNameMatchInfo*
TZGNCore::findLocal(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    GNameSearchHandler handler(types);

    TZGNCore *nonConstThis = const_cast<TZGNCore *>(this);

    umtx_lock(&gLock);
    {
        fGNamesTrie.search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    }
    umtx_unlock(&gLock);

    if (U_FAILURE(status)) {
        return NULL;
    }

    TimeZoneGenericNameMatchInfo *gmatchInfo = NULL;

    int32_t maxLen = 0;
    UVector *results = handler.getMatches(maxLen);
    if (results != NULL && ((maxLen == (text.length() - start)) || fGNamesTrieFullyLoaded)) {
        // perfect match
        gmatchInfo = new TimeZoneGenericNameMatchInfo(results);
        if (gmatchInfo == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            delete results;
            return NULL;
        }
        return gmatchInfo;
    }

    if (results != NULL) {
        delete results;
    }

    // All names are not yet loaded into the local trie.
    // Load all available names into the trie. This could be very heavy.
    umtx_lock(&gLock);
    {
        if (!fGNamesTrieFullyLoaded) {
            StringEnumeration *tzIDs = TimeZone::createTimeZoneIDEnumeration(UCAL_ZONE_TYPE_CANONICAL, NULL, NULL, status);
            if (U_SUCCESS(status)) {
                const UnicodeString *tzID;
                while ((tzID = tzIDs->snext(status)) != NULL) {
                    if (U_FAILURE(status)) {
                        break;
                    }
                    nonConstThis->loadStrings(*tzID);
                }
            }
            if (tzIDs != NULL) {
                delete tzIDs;
            }

            if (U_SUCCESS(status)) {
                nonConstThis->fGNamesTrieFullyLoaded = TRUE;
            }
        }
    }
    umtx_unlock(&gLock);

    if (U_FAILURE(status)) {
        return NULL;
    }

    umtx_lock(&gLock);
    {
        // now try it again
        fGNamesTrie.search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    }
    umtx_unlock(&gLock);

    results = handler.getMatches(maxLen);
    if (results != NULL && maxLen > 0) {
        gmatchInfo = new TimeZoneGenericNameMatchInfo(results);
        if (gmatchInfo == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            delete results;
            return NULL;
        }
    }

    return gmatchInfo;
}